

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

void __thiscall Channel::~Channel(Channel *this)

{
  std::_Function_base::~_Function_base(&(this->closeCallback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->errorCallback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->writeCallback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->readCallback_).super__Function_base);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<Channel>)._M_weak_this.
              super___weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Channel::~Channel() {}